

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

RAMBlock * qemu_get_ram_block(uc_struct_conflict15 *uc,ram_addr_t addr)

{
  uc_struct_conflict15 *local_28;
  RAMBlock *block;
  ram_addr_t addr_local;
  uc_struct_conflict15 *uc_local;
  
  uc_local = (uc_struct_conflict15 *)(uc->ram_list).mru_block;
  if ((uc_local == (uc_struct_conflict15 *)0x0) ||
     ((uc_local->address_space_memory).listeners.tqh_first <=
      (MemoryListener *)(addr - (long)(uc_local->address_space_memory).root))) {
    local_28 = (uc_struct_conflict15 *)(uc->ram_list).blocks.lh_first;
    while( true ) {
      if (local_28 == (uc_struct_conflict15 *)0x0) {
        fprintf(_stderr,"Bad ram offset %lx\n",addr);
        abort();
      }
      if ((MemoryListener *)(addr - (long)(local_28->address_space_memory).root) <
          (local_28->address_space_memory).listeners.tqh_first) break;
      local_28 = (uc_struct_conflict15 *)
                 (local_28->address_space_memory).address_spaces_link.tqe_next;
    }
    (uc->ram_list).mru_block = (RAMBlock *)local_28;
    uc_local = local_28;
  }
  return (RAMBlock *)uc_local;
}

Assistant:

static RAMBlock *qemu_get_ram_block(struct uc_struct *uc, ram_addr_t addr)
{
    RAMBlock *block;

    block = uc->ram_list.mru_block;
    if (block && addr - block->offset < block->max_length) {
        return block;
    }
    RAMBLOCK_FOREACH(block) {
        if (addr - block->offset < block->max_length) {
            goto found;
        }
    }

    fprintf(stderr, "Bad ram offset %" PRIx64 "\n", (uint64_t)addr);
    abort();

found:
    uc->ram_list.mru_block = block;
    return block;
}